

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_rect nk_widget_bounds(nk_context *ctx)

{
  undefined8 uVar1;
  nk_rect nVar3;
  nk_rect bounds;
  nk_rect local_18;
  undefined8 uVar2;
  
  uVar1._0_4_ = 0.0;
  uVar1._4_4_ = 0.0;
  if (ctx != (nk_context *)0x0) {
    uVar2._0_4_ = 0.0;
    uVar2._4_4_ = 0.0;
    if (ctx->current != (nk_window *)0x0) {
      nk_layout_peek(&local_18,ctx);
      uVar1 = local_18._0_8_;
      uVar2 = local_18._8_8_;
    }
    nVar3.w = (float)uVar2;
    nVar3.h = SUB84(uVar2,4);
    nVar3.x = (float)uVar1;
    nVar3.y = SUB84(uVar1,4);
    return nVar3;
  }
  return (nk_rect)ZEXT816(0);
}

Assistant:

NK_API struct nk_rect
nk_widget_bounds(struct nk_context *ctx)
{
struct nk_rect bounds;
NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
if (!ctx || !ctx->current)
return nk_rect(0,0,0,0);
nk_layout_peek(&bounds, ctx);
return bounds;
}